

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O2

void __thiscall duckdb::StreamingWindowState::AggregateState::~AggregateState(AggregateState *this)

{
  AggregateInputData aggr_input_data;
  
  if (this->dtor != (aggregate_destructor_t)0x0) {
    aggr_input_data.bind_data.ptr = this->bind_data;
    aggr_input_data.allocator = &this->arena_allocator;
    aggr_input_data.combine_type = PRESERVE_INPUT;
    this->state_ptr =
         (this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (*this->dtor)(&this->statev,&aggr_input_data,1);
  }
  Vector::~Vector(&this->addresses);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->distinct_sel).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vector::~Vector(&this->hashes);
  DataChunk::~DataChunk(&this->distinct_args);
  ::std::
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ::~unique_ptr(&(this->distinct).
                 super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
               );
  DataChunk::~DataChunk(&this->arg_cursor);
  DataChunk::~DataChunk(&this->arg_chunk);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->arg_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->filter_sel).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vector::~Vector(&this->statev);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&this->state);
  ExpressionExecutor::~ExpressionExecutor(&this->filter_executor);
  ExpressionExecutor::~ExpressionExecutor(&this->executor);
  ArenaAllocator::~ArenaAllocator(&this->arena_allocator);
  return;
}

Assistant:

~AggregateState() {
			if (dtor) {
				AggregateInputData aggr_input_data(bind_data, arena_allocator);
				state_ptr = state.data();
				dtor(statev, aggr_input_data, 1);
			}
		}